

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_byte_array_stop_encode(cram_slice *slice,cram_codec *c,char *in,int in_size)

{
  size_t sVar1;
  uchar uVar2;
  uchar *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double local_38;
  double local_30;
  int in_size_local;
  char *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  while (c->out->alloc <= c->out->byte + (long)in_size) {
    if (c->out->alloc == 0) {
      local_30 = 1024.0;
    }
    else {
      sVar1 = c->out->alloc;
      auVar4._8_4_ = (int)(sVar1 >> 0x20);
      auVar4._0_8_ = sVar1;
      auVar4._12_4_ = 0x45300000;
      local_30 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
    }
    c->out->alloc =
         (long)local_30 | (long)(local_30 - 9.223372036854776e+18) & (long)local_30 >> 0x3f;
    puVar3 = (uchar *)realloc(c->out->data,c->out->alloc);
    c->out->data = puVar3;
  }
  memcpy(c->out->data + c->out->byte,in,(long)in_size);
  c->out->byte = (long)in_size + c->out->byte;
  while (c->out->alloc <= c->out->byte + 1) {
    if (c->out->alloc == 0) {
      local_38 = 1024.0;
    }
    else {
      sVar1 = c->out->alloc;
      auVar5._8_4_ = (int)(sVar1 >> 0x20);
      auVar5._0_8_ = sVar1;
      auVar5._12_4_ = 0x45300000;
      local_38 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
    }
    c->out->alloc =
         (long)local_38 | (long)(local_38 - 9.223372036854776e+18) & (long)local_38 >> 0x3f;
    puVar3 = (uchar *)realloc(c->out->data,c->out->alloc);
    c->out->data = puVar3;
  }
  uVar2 = (c->field_6).byte_array_stop.stop;
  puVar3 = c->out->data;
  sVar1 = c->out->byte;
  c->out->byte = sVar1 + 1;
  puVar3[sVar1] = uVar2;
  return 0;
}

Assistant:

int cram_byte_array_stop_encode(cram_slice *slice, cram_codec *c,
				char *in, int in_size) {
    BLOCK_APPEND(c->out, in, in_size);
    BLOCK_APPEND_CHAR(c->out, c->e_byte_array_stop.stop);
    return 0;
}